

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeEmitter.cpp
# Opt level: O0

void __thiscall CodeEmitter::emitValue(CodeEmitter *this,AstNode *valueNode,Word word)

{
  reference pvVar1;
  allocator local_1f9;
  string local_1f8 [36];
  Word local_1d4;
  Word local_1d0;
  allocator local_1c9;
  string local_1c8 [39];
  allocator local_1a1;
  string local_1a0 [32];
  string local_180 [32];
  undefined1 local_160 [8];
  AstNode referenceNode_1;
  AstNode secondParenNode;
  undefined1 local_a0 [8];
  AstNode referenceNode;
  string local_40 [32];
  AstNode *local_20;
  AstNode *valueNode_local;
  CodeEmitter *this_local;
  Word word_local;
  
  local_20 = valueNode;
  valueNode_local = (AstNode *)this;
  if (valueNode->type == ReferenceNode) {
    this_local._4_4_ = (Word)CONCAT22(0xffff,(ushort)word.data & 0xcfff);
    std::__cxx11::string::string(local_40,(string *)&valueNode->sValue);
    markReference(this,(string *)local_40);
    std::__cxx11::string::~string(local_40);
    referenceNode.children.super__Vector_base<AstNode,_std::allocator<AstNode>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = this_local._4_4_;
    emitWord(this,this_local._4_4_);
  }
  else if (valueNode->type == ParenNode) {
    this_local._4_4_ = word.data & 0xffffU | 0xffff0000;
    pvVar1 = std::vector<AstNode,_std::allocator<AstNode>_>::front(&valueNode->children);
    if (pvVar1->type == ReferenceNode) {
      pvVar1 = std::vector<AstNode,_std::allocator<AstNode>_>::front(&valueNode->children);
      AstNode::AstNode((AstNode *)local_a0,pvVar1);
      this_local._4_4_ = this_local._4_4_ & 0xffffcfffU | 0x1000;
      std::__cxx11::string::string
                ((string *)
                 &secondParenNode.children.super__Vector_base<AstNode,_std::allocator<AstNode>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&referenceNode.bValue)
      ;
      markReference(this,(string *)
                         &secondParenNode.children.
                          super__Vector_base<AstNode,_std::allocator<AstNode>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string
                ((string *)
                 &secondParenNode.children.super__Vector_base<AstNode,_std::allocator<AstNode>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      AstNode::~AstNode((AstNode *)local_a0);
    }
    else {
      pvVar1 = std::vector<AstNode,_std::allocator<AstNode>_>::front(&valueNode->children);
      if (pvVar1->type == ParenNode) {
        pvVar1 = std::vector<AstNode,_std::allocator<AstNode>_>::front(&valueNode->children);
        AstNode::AstNode((AstNode *)
                         &referenceNode_1.children.
                          super__Vector_base<AstNode,_std::allocator<AstNode>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,pvVar1);
        pvVar1 = std::vector<AstNode,_std::allocator<AstNode>_>::front
                           ((vector<AstNode,_std::allocator<AstNode>_> *)&secondParenNode.field_0x30
                           );
        if (pvVar1->type == ReferenceNode) {
          pvVar1 = std::vector<AstNode,_std::allocator<AstNode>_>::front
                             ((vector<AstNode,_std::allocator<AstNode>_> *)
                              &secondParenNode.field_0x30);
          AstNode::AstNode((AstNode *)local_160,pvVar1);
          this_local._4_4_ = this_local._4_4_ & 0xffffcfffU | 0x2000;
          std::__cxx11::string::string(local_180,(string *)&referenceNode_1.bValue);
          markReference(this,(string *)local_180);
          std::__cxx11::string::~string(local_180);
          AstNode::~AstNode((AstNode *)local_160);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1a0,"wrong paren content",&local_1a1);
          emitterError(this,(string *)local_1a0);
          std::__cxx11::string::~string(local_1a0);
          std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
        }
        AstNode::~AstNode((AstNode *)
                          &referenceNode_1.children.
                           super__Vector_base<AstNode,_std::allocator<AstNode>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1c8,"wrong paren content",&local_1c9);
        emitterError(this,(string *)local_1c8);
        std::__cxx11::string::~string(local_1c8);
        std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
      }
    }
    local_1d0 = this_local._4_4_;
    emitWord(this,this_local._4_4_);
  }
  else if (valueNode->type == NumberNode) {
    local_1d4.data = word.data & 0xcfffU | (int)valueNode->aValue << 0x10;
    this_local._4_4_ = local_1d4.data;
    emitWord(this,local_1d4);
  }
  else {
    this_local._4_4_ = word;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1f8,"wrong instruction argument",&local_1f9);
    emitterError(this,(string *)local_1f8);
    std::__cxx11::string::~string(local_1f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  }
  return;
}

Assistant:

void CodeEmitter::emitValue(AstNode valueNode, Word word) {
    if(valueNode.type == AstNode::ReferenceNode) {
        word.instruction.mod = 0;
        word.instruction.adr = -1;
        markReference(valueNode.sValue);
        emitWord(word);
    } else if(valueNode.type == AstNode::ParenNode) {
        word.instruction.adr = -1;

        if(valueNode.children.front().type == AstNode::ReferenceNode) {
            AstNode referenceNode = valueNode.children.front();
            word.instruction.mod = 1;
            markReference(referenceNode.sValue);
        } else if(valueNode.children.front().type == AstNode::ParenNode) {
            AstNode secondParenNode = valueNode.children.front();
            if(secondParenNode.children.front().type == AstNode::ReferenceNode) {
                AstNode referenceNode = secondParenNode.children.front();
                word.instruction.mod = 2;
                markReference(referenceNode.sValue);
            } else {
                emitterError("wrong paren content");
            }
        } else {
            emitterError("wrong paren content");
        }

        emitWord(word);
    } else if(valueNode.type == AstNode::NumberNode) {
        word.instruction.mod = 0;
        word.instruction.adr = valueNode.aValue;
        emitWord(word);
    } else {
        emitterError("wrong instruction argument");
    }
}